

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferCopyTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::BasicBufferCopyCase::iterate(BasicBufferCopyCase *this)

{
  int iVar1;
  RenderContext *renderCtx;
  deUint32 dVar2;
  deUint32 dVar3;
  GLenum GVar4;
  uint uVar5;
  uint uVar6;
  TestLog *log;
  char *pcVar7;
  deUint8 *pdVar8;
  deUint8 *pdVar9;
  bool local_126;
  bool isOk;
  deUint32 dstSeed;
  deUint32 srcSeed;
  deUint32 dstBuf;
  deUint32 srcBuf;
  ReferenceBuffer dstRef;
  undefined1 local_30 [8];
  ReferenceBuffer srcRef;
  BufferVerifier verifier;
  BasicBufferCopyCase *this_local;
  
  renderCtx = (this->super_BufferCase).m_renderCtx;
  log = tcu::TestContext::getLog((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx);
  deqp::gls::BufferTestUtil::BufferVerifier::BufferVerifier
            ((BufferVerifier *)
             &srcRef.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,renderCtx,log,this->m_verifyType);
  deqp::gls::BufferTestUtil::ReferenceBuffer::ReferenceBuffer((ReferenceBuffer *)local_30);
  deqp::gls::BufferTestUtil::ReferenceBuffer::ReferenceBuffer((ReferenceBuffer *)&dstBuf);
  pcVar7 = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(pcVar7);
  pcVar7 = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(pcVar7);
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize((ReferenceBuffer *)local_30,this->m_srcSize);
  pdVar8 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_30,0);
  deqp::gls::BufferTestUtil::fillWithRandomBytes(pdVar8,this->m_srcSize,dVar2 ^ 0xabcd);
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize((ReferenceBuffer *)&dstBuf,this->m_dstSize);
  pdVar8 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&dstBuf,0);
  deqp::gls::BufferTestUtil::fillWithRandomBytes(pdVar8,this->m_dstSize,dVar3 ^ 0xef01);
  dVar2 = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_srcTarget,dVar2);
  GVar4 = this->m_srcTarget;
  iVar1 = this->m_srcSize;
  pdVar8 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_30,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BufferCase).super_CallLogWrapper,GVar4,(long)iVar1,pdVar8,this->m_srcHint
            );
  GVar4 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
  glu::checkError(GVar4,"glBufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferCopyTests.cpp"
                  ,100);
  dVar3 = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_dstTarget,dVar3);
  GVar4 = this->m_dstTarget;
  iVar1 = this->m_dstSize;
  pdVar8 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&dstBuf,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BufferCase).super_CallLogWrapper,GVar4,(long)iVar1,pdVar8,this->m_dstHint
            );
  GVar4 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
  glu::checkError(GVar4,"glBufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferCopyTests.cpp"
                  ,0x6a);
  pdVar8 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_30,0);
  uVar5 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                    ((BufferVerifier *)
                     &srcRef.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(EVP_PKEY_CTX *)(ulong)dVar2,pdVar8,
                     0,(uchar *)(ulong)(uint)this->m_srcSize,(ulong)this->m_srcTarget);
  pdVar8 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&dstBuf,0);
  uVar6 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                    ((BufferVerifier *)
                     &srcRef.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(EVP_PKEY_CTX *)(ulong)dVar3,pdVar8,
                     0,(uchar *)(ulong)(uint)this->m_dstSize,(ulong)this->m_dstTarget);
  local_126 = (uVar6 & 1) != 0 && (uVar5 & 1) != 0;
  pdVar8 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&dstBuf,0);
  iVar1 = this->m_copyDstOffset;
  pdVar9 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_30,0);
  ::deMemcpy(pdVar8 + iVar1,pdVar9 + this->m_copySrcOffset,(long)this->m_copySize);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_srcTarget,dVar2);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_dstTarget,dVar3);
  glu::CallLogWrapper::glCopyBufferSubData
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_srcTarget,this->m_dstTarget,
             (long)this->m_copySrcOffset,(long)this->m_copyDstOffset,(long)this->m_copySize);
  GVar4 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
  glu::checkError(GVar4,"glCopyBufferSubData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferCopyTests.cpp"
                  ,0x76);
  pdVar8 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_30,0);
  uVar5 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                    ((BufferVerifier *)
                     &srcRef.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(EVP_PKEY_CTX *)(ulong)dVar2,pdVar8,
                     0,(uchar *)(ulong)(uint)this->m_srcSize,(ulong)this->m_srcTarget);
  if ((uVar5 & 1) == 0) {
    local_126 = false;
  }
  pdVar8 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&dstBuf,0);
  uVar5 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                    ((BufferVerifier *)
                     &srcRef.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(EVP_PKEY_CTX *)(ulong)dVar3,pdVar8,
                     0,(uchar *)(ulong)(uint)this->m_dstSize,(ulong)this->m_dstTarget);
  if ((uVar5 & 1) == 0) {
    local_126 = false;
  }
  pcVar7 = "Buffer verification failed";
  if (local_126) {
    pcVar7 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,(uint)(byte)~local_126
             ,pcVar7);
  deqp::gls::BufferTestUtil::ReferenceBuffer::~ReferenceBuffer((ReferenceBuffer *)&dstBuf);
  deqp::gls::BufferTestUtil::ReferenceBuffer::~ReferenceBuffer((ReferenceBuffer *)local_30);
  deqp::gls::BufferTestUtil::BufferVerifier::~BufferVerifier
            ((BufferVerifier *)
             &srcRef.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		BufferVerifier	verifier	(m_renderCtx, m_testCtx.getLog(), m_verifyType);
		ReferenceBuffer	srcRef;
		ReferenceBuffer	dstRef;
		deUint32		srcBuf		= 0;
		deUint32		dstBuf		= 0;
		deUint32		srcSeed		= deStringHash(getName()) ^ 0xabcd;
		deUint32		dstSeed		= deStringHash(getName()) ^ 0xef01;
		bool			isOk		= true;

		srcRef.setSize(m_srcSize);
		fillWithRandomBytes(srcRef.getPtr(), m_srcSize, srcSeed);

		dstRef.setSize(m_dstSize);
		fillWithRandomBytes(dstRef.getPtr(), m_dstSize, dstSeed);

		// Create source buffer and fill with data.
		srcBuf = genBuffer();
		glBindBuffer(m_srcTarget, srcBuf);
		glBufferData(m_srcTarget, m_srcSize, srcRef.getPtr(), m_srcHint);
		GLU_CHECK_MSG("glBufferData");

		// Create destination buffer and fill with data.
		dstBuf = genBuffer();
		glBindBuffer(m_dstTarget, dstBuf);
		glBufferData(m_dstTarget, m_dstSize, dstRef.getPtr(), m_dstHint);
		GLU_CHECK_MSG("glBufferData");

		// Verify both buffers before executing copy.
		isOk = verifier.verify(srcBuf, srcRef.getPtr(), 0, m_srcSize, m_srcTarget) && isOk;
		isOk = verifier.verify(dstBuf, dstRef.getPtr(), 0, m_dstSize, m_dstTarget) && isOk;

		// Execute copy.
		deMemcpy(dstRef.getPtr()+m_copyDstOffset, srcRef.getPtr()+m_copySrcOffset, m_copySize);

		glBindBuffer(m_srcTarget, srcBuf);
		glBindBuffer(m_dstTarget, dstBuf);
		glCopyBufferSubData(m_srcTarget, m_dstTarget, m_copySrcOffset, m_copyDstOffset, m_copySize);
		GLU_CHECK_MSG("glCopyBufferSubData");

		// Verify both buffers after copy.
		isOk = verifier.verify(srcBuf, srcRef.getPtr(), 0, m_srcSize, m_srcTarget) && isOk;
		isOk = verifier.verify(dstBuf, dstRef.getPtr(), 0, m_dstSize, m_dstTarget) && isOk;

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}